

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O0

void __thiscall FTraceInfo::Setup3DFloors(FTraceInfo *this)

{
  sector_t_conflict *psVar1;
  secplane_t *psVar2;
  bool bVar3;
  uint uVar4;
  xfloor *this_00;
  F3DFloor **ppFVar5;
  double dVar6;
  TVector2<double> local_e0;
  double local_d0;
  double ff_top;
  double local_b8;
  double ff_bottom;
  F3DFloor *local_a0;
  F3DFloor *rover;
  iterator __end2;
  iterator __begin2;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range2;
  double local_70;
  double bc;
  double local_58;
  double bf;
  undefined1 local_38 [8];
  DVector3 pos;
  double sdist;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *ff;
  FTraceInfo *this_local;
  
  this_00 = &this->CurSector->e->XFloor;
  uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size((TArray<F3DFloor_*,_F3DFloor_*> *)this_00);
  if (uVar4 != 0) {
    memcpy(this->DummySector,this->CurSector,0x218);
    this->CurSector = this->DummySector;
    this->sectorsel = 1;
    pos.Z = this->MaxDist * this->startfrac;
    ::operator*((TVector3<double> *)&bf,&this->Vec,pos.Z);
    TVector3<double>::operator+((TVector3<double> *)local_38,&this->Start,(TVector3<double> *)&bf);
    psVar1 = this->CurSector;
    TVector2<double>::TVector2((TVector2<double> *)&bc,(TVector3<double> *)local_38);
    local_58 = secplane_t::ZatPoint(&psVar1->floorplane,(DVector2 *)&bc);
    psVar1 = this->CurSector;
    TVector2<double>::TVector2((TVector2<double> *)&__range2,(TVector3<double> *)local_38);
    local_70 = secplane_t::ZatPoint(&psVar1->ceilingplane,(DVector2 *)&__range2);
    __end2 = TArray<F3DFloor_*,_F3DFloor_*>::begin((TArray<F3DFloor_*,_F3DFloor_*> *)this_00);
    rover = (F3DFloor *)
            TArray<F3DFloor_*,_F3DFloor_*>::end((TArray<F3DFloor_*,_F3DFloor_*> *)this_00);
    while (bVar3 = TIterator<F3DFloor_*>::operator!=(&__end2,(TIterator<F3DFloor_*> *)&rover), bVar3
          ) {
      ppFVar5 = TIterator<F3DFloor_*>::operator*(&__end2);
      local_a0 = *ppFVar5;
      if ((local_a0->flags & 1) != 0) {
        if ((((local_a0->flags & 0x10) != 0) && (this->Results->Crossed3DWater == (F3DFloor *)0x0))
           && (bVar3 = Check3DFloorPlane(this,local_a0,false), bVar3)) {
          psVar2 = (local_a0->top).plane;
          TVector2<double>::TVector2((TVector2<double> *)&ff_bottom,&this->Results->HitPos);
          dVar6 = secplane_t::ZatPoint(psVar2,(DVector2 *)&ff_bottom);
          if (local_58 < dVar6) {
            this->Results->Crossed3DWater = local_a0;
            TVector3<double>::operator=(&this->Results->Crossed3DWaterPos,&this->Results->HitPos);
            this->Results->Distance = 0.0;
          }
        }
        if ((local_a0->flags & 0x4000000) == 0) {
          psVar2 = (local_a0->bottom).plane;
          TVector2<double>::TVector2((TVector2<double> *)&ff_top,(TVector3<double> *)local_38);
          local_b8 = secplane_t::ZatPoint(psVar2,(DVector2 *)&ff_top);
          psVar2 = (local_a0->top).plane;
          TVector2<double>::TVector2(&local_e0,(TVector3<double> *)local_38);
          local_d0 = secplane_t::ZatPoint(psVar2,&local_e0);
          if (pos.Y <= local_d0) {
            if (local_b8 <= pos.Y) {
              if (local_58 < local_b8) {
                secplane_t::operator=(&this->CurSector->floorplane,(local_a0->bottom).plane);
                sector_t::SetTexture
                          ((sector_t *)this->CurSector,0,
                           (FTextureID)((local_a0->bottom).texture)->texnum,false);
                sector_t::ClearPortal((sector_t *)this->CurSector,0);
                local_58 = local_b8;
              }
              if (local_d0 < local_70) {
                secplane_t::operator=(&this->CurSector->ceilingplane,(local_a0->top).plane);
                sector_t::SetTexture
                          ((sector_t *)this->CurSector,1,
                           (FTextureID)((local_a0->top).texture)->texnum,false);
                sector_t::ClearPortal((sector_t *)this->CurSector,1);
                local_70 = local_d0;
              }
              this->inshootthrough = 0;
            }
            else if (local_b8 < local_70) {
              secplane_t::operator=(&this->CurSector->ceilingplane,(local_a0->bottom).plane);
              sector_t::SetTexture
                        ((sector_t *)this->CurSector,1,
                         (FTextureID)((local_a0->bottom).texture)->texnum,false);
              local_70 = local_b8;
              sector_t::ClearPortal((sector_t *)this->CurSector,1);
            }
          }
          else if (local_58 < local_d0) {
            secplane_t::operator=(&this->CurSector->floorplane,(local_a0->top).plane);
            sector_t::SetTexture
                      ((sector_t *)this->CurSector,0,(FTextureID)((local_a0->top).texture)->texnum,
                       false);
            sector_t::ClearPortal((sector_t *)this->CurSector,0);
            local_58 = local_d0;
          }
        }
      }
      TIterator<F3DFloor_*>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void FTraceInfo::Setup3DFloors()
{
	TDeletingArray<F3DFloor*> &ff = CurSector->e->XFloor.ffloors;

	if (ff.Size())
	{
		memcpy(&DummySector[0], CurSector, sizeof(sector_t));
		CurSector = &DummySector[0];
		sectorsel = 1;

		double sdist = MaxDist * startfrac;
		DVector3 pos = Start + Vec * sdist;


		double bf = CurSector->floorplane.ZatPoint(pos);
		double bc = CurSector->ceilingplane.ZatPoint(pos);

		for (auto rover : ff)
		{
			if (!(rover->flags&FF_EXISTS))
				continue;

			if (rover->flags&FF_SWIMMABLE && Results->Crossed3DWater == NULL)
			{
				if (Check3DFloorPlane(rover, false))
				{
					// only consider if the plane is above the actual floor.
					if (rover->top.plane->ZatPoint(Results->HitPos) > bf)
					{
						Results->Crossed3DWater = rover;
						Results->Crossed3DWaterPos = Results->HitPos;
						Results->Distance = 0;
					}
				}
			}

			if (!(rover->flags&FF_SHOOTTHROUGH))
			{
				double ff_bottom = rover->bottom.plane->ZatPoint(pos);
				double ff_top = rover->top.plane->ZatPoint(pos);
				// clip to the part of the sector we are in
				if (pos.Z > ff_top)
				{
					// above
					if (bf < ff_top)
					{
						CurSector->floorplane = *rover->top.plane;
						CurSector->SetTexture(sector_t::floor, *rover->top.texture, false);
						CurSector->ClearPortal(sector_t::floor);
						bf = ff_top;
					}
				}
				else if (pos.Z < ff_bottom)
				{
					//below
					if (bc > ff_bottom)
					{
						CurSector->ceilingplane = *rover->bottom.plane;
						CurSector->SetTexture(sector_t::ceiling, *rover->bottom.texture, false);
						bc = ff_bottom;
						CurSector->ClearPortal(sector_t::ceiling);
					}
				}
				else
				{
					// inside
					if (bf < ff_bottom)
					{
						CurSector->floorplane = *rover->bottom.plane;
						CurSector->SetTexture(sector_t::floor, *rover->bottom.texture, false);
						CurSector->ClearPortal(sector_t::floor);
						bf = ff_bottom;
					}

					if (bc > ff_top)
					{
						CurSector->ceilingplane = *rover->top.plane;
						CurSector->SetTexture(sector_t::ceiling, *rover->top.texture, false);
						CurSector->ClearPortal(sector_t::ceiling);
						bc = ff_top;
					}
					inshootthrough = false;
				}
			}
		}
	}
}